

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

size_t appendEscapedSubstring(char *str,size_t i)

{
  size_t sVar1;
  char local_19;
  char v_4;
  char v_3;
  char v_2;
  char v_1;
  char v;
  ulong uStack_18;
  char c;
  size_t i_local;
  char *str_local;
  
  uStack_18 = i;
  i_local = (size_t)str;
  while (*(char *)i_local != '\0') {
    sVar1 = i_local + 1;
    local_19 = *(char *)i_local;
    if (local_19 == '\t') {
      if (uStack_18 < 0x100) {
        yylval.symName[uStack_18] = '\\';
        uStack_18 = uStack_18 + 1;
      }
      local_19 = 't';
    }
    else if (local_19 == '\n') {
      if (uStack_18 < 0x100) {
        yylval.symName[uStack_18] = '\\';
        uStack_18 = uStack_18 + 1;
      }
      local_19 = 'n';
    }
    else if (local_19 == '\r') {
      if (uStack_18 < 0x100) {
        yylval.symName[uStack_18] = '\\';
        uStack_18 = uStack_18 + 1;
      }
      local_19 = 'r';
    }
    else if ((((local_19 == '\"') || (local_19 == '\\')) || (local_19 == '{')) &&
            (uStack_18 < 0x100)) {
      yylval.symName[uStack_18] = '\\';
      uStack_18 = uStack_18 + 1;
    }
    i_local = sVar1;
    if (uStack_18 < 0x100) {
      yylval.symName[uStack_18] = local_19;
      uStack_18 = uStack_18 + 1;
    }
  }
  return uStack_18;
}

Assistant:

static size_t appendEscapedSubstring(char const *str, size_t i)
{
	// Copy one extra to flag overflow
	while (*str) {
		char c = *str++;

		// Escape characters that need escaping
		switch (c) {
		case '\\':
		case '"':
		case '{':
			append_yylval_string('\\');
			break;
		case '\n':
			append_yylval_string('\\');
			c = 'n';
			break;
		case '\r':
			append_yylval_string('\\');
			c = 'r';
			break;
		case '\t':
			append_yylval_string('\\');
			c = 't';
			break;
		}

		append_yylval_string(c);
	}

	return i;
}